

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall FInterpolator::DoInterpolations(FInterpolator *this,double smoothratio)

{
  DInterpolation *pDVar1;
  DInterpolation *pDVar2;
  
  if (1.0 <= smoothratio) {
    this->didInterp = false;
  }
  else {
    this->didInterp = true;
    pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)this);
    while (pDVar1 != (DInterpolation *)0x0) {
      pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)&pDVar1->Next);
      (*(pDVar1->super_DObject)._vptr_DObject[9])(smoothratio,pDVar1);
      pDVar1 = pDVar2;
    }
  }
  return;
}

Assistant:

void FInterpolator::DoInterpolations(double smoothratio)
{
	if (smoothratio >= 1.)
	{
		didInterp = false;
		return;
	}

	didInterp = true;

	DInterpolation *probe = Head;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Interpolate(smoothratio);
		probe = next;
	}
}